

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

bool __thiscall
xscript::parser::ast::parse_expression
          (ast *this,
          unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
          *parent,int precedence)

{
  token_t_conflict tVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> args_00;
  bool bVar2;
  pointer paVar3;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  basic_string_view<char,_std::char_traits<char>_> *local_d0;
  undefined8 local_c8;
  allocator<char> local_b9;
  string local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  basic_string_view<char,_std::char_traits<char>_> *local_88;
  undefined8 local_80;
  allocator<char> local_61;
  string local_60;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *local_40;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
  *binary_expression;
  token_t t;
  int p;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
  *unary_expression;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_> *puStack_20
  ;
  int precedence_local;
  unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
  *parent_local;
  ast *this_local;
  
  tVar1 = (this->cur_token).type;
  unary_expression._4_4_ = precedence;
  puStack_20 = parent;
  parent_local = (unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
                  *)this;
  if ((((tVar1 == TK_SUB) || (tVar1 == TK_BITWISE_NOT)) || (tVar1 - TK_LOGIC_NOT < 3)) ||
     ((tVar1 == TK_TYPEOF || (tVar1 == TK_CO)))) {
    paVar3 = std::
             unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
             ::operator->(parent);
    _t = ast_node::add_child(paVar3,UNARY_EXPRESSION);
    bVar2 = parse_token(this,_t);
    if (!bVar2) {
      return false;
    }
    bVar2 = parse_expression(this,_t,2);
    if (!bVar2) {
      return false;
    }
  }
  else {
    bVar2 = parse_basic_expression(this,parent);
    if (!bVar2) {
      return false;
    }
  }
  binary_expression._4_4_ = operator_precedence(this,(this->cur_token).type);
  while( true ) {
    if (binary_expression._4_4_ < 0) {
      return true;
    }
    if ((this->cur_token).type - TK_ASSIGN < 0xd) {
      if (unary_expression._4_4_ < binary_expression._4_4_) {
        return true;
      }
    }
    else if (unary_expression._4_4_ <= binary_expression._4_4_) {
      return true;
    }
    binary_expression._0_4_ = (this->cur_token).type;
    paVar3 = std::
             unique_ptr<xscript::parser::ast_node,_std::default_delete<xscript::parser::ast_node>_>
             ::operator->(puStack_20);
    local_40 = ast_node::replace_child(paVar3,BINARY_EXPRESSION);
    bVar2 = parse_token(this,local_40);
    if (!bVar2) break;
    if ((token_t_conflict)binary_expression == TK_LEFT_PAREN) {
      bVar2 = parse_function_call_parameter(this,local_40);
      if (!bVar2) {
        return false;
      }
      bVar2 = tokenizer::token::operator!=(&this->cur_token,TK_RIGHT_PAREN);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,"build_O0/src/CMakeFiles/xscript.dir/compiler_depend.ts",
                   &local_61);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_98,"\')\' expected");
        local_80 = 1;
        args_00._M_len = 1;
        args_00._M_array = &local_98;
        local_88 = &local_98;
        append_syntax_error(this,&local_60,0x245,args_00);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator(&local_61);
      }
      else {
        next(this);
      }
    }
    else if ((token_t_conflict)binary_expression == TK_LEFT_BRACK) {
      bVar2 = tokenizer::token::operator!=(&this->cur_token,TK_RIGHT_BRACK);
      if ((bVar2) && (bVar2 = parse_expression(this,local_40), !bVar2)) {
        return false;
      }
      bVar2 = tokenizer::token::operator!=(&this->cur_token,TK_RIGHT_BRACK);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"build_O0/src/CMakeFiles/xscript.dir/compiler_depend.ts",
                   &local_b9);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_e0,"\']\' expected");
        local_c8 = 1;
        args._M_len = 1;
        args._M_array = &local_e0;
        local_d0 = &local_e0;
        append_syntax_error(this,&local_b8,0x251,args);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator(&local_b9);
      }
      else {
        next(this);
      }
    }
    else {
      bVar2 = parse_expression(this,local_40,binary_expression._4_4_);
      if (!bVar2) {
        return false;
      }
    }
    binary_expression._4_4_ = operator_precedence(this,(this->cur_token).type);
  }
  return false;
}

Assistant:

bool ast::parse_expression(std::unique_ptr<ast_node>& parent, int precedence) {
    switch (cur_token.type) {
        case tokenizer::TK_LOGIC_NOT: // 逻辑非运算符
        case tokenizer::TK_BITWISE_NOT: // 按位取反运算符
        case tokenizer::TK_SUB: // 负号运算符
        case tokenizer::TK_INC: // 自增运算符
        case tokenizer::TK_DEC: // 自减运算符
        case tokenizer::TK_CO:  // 协程运算符
        case tokenizer::TK_TYPEOF: // 类型运算符
        {
            std::unique_ptr<ast_node>& unary_expression = parent->add_child(UNARY_EXPRESSION);
            if (!parse_token(unary_expression)) {
                return false;
            } 
            if (!parse_expression(unary_expression, 2)) {
                return false;
            }
            break;
        }
        default:
            if (!parse_basic_expression(parent)) {
                return false;
            }
    }

    int p = operator_precedence(cur_token.type);
    while (true) {
        if (p < 0) {
            return true;
        } else {
            switch (cur_token.type) {
                case tokenizer::TK_LOGIC_AND:
                case tokenizer::TK_LOGIC_OR:
                case tokenizer::TK_ASSIGN:
                case tokenizer::TK_ASSIGN_ADD:
                case tokenizer::TK_ASSIGN_SUB:
                case tokenizer::TK_ASSIGN_MUL:
                case tokenizer::TK_ASSIGN_DIV:
                case tokenizer::TK_ASSIGN_MOD:
                case tokenizer::TK_ASSIGN_AND:
                case tokenizer::TK_ASSIGN_OR:
                case tokenizer::TK_ASSIGN_XOR:
                case tokenizer::TK_ASSIGN_SHL:
                case tokenizer::TK_ASSIGN_SHR:
                    // 右结合操作符
                    if (p > precedence) {
                        return true;
                    }
                    break;
                default:
                    // 左结合操作符
                    if (p >= precedence) {
                        return true;
                    }
            }
        }

        tokenizer::token_t t = cur_token.type;

        std::unique_ptr<ast_node>& binary_expression = parent->replace_child(BINARY_EXPRESSION);
        if (!parse_token(binary_expression)) {
            return false;
        }

        if (t == tokenizer::TK_LEFT_PAREN) {
            if (!parse_function_call_parameter(binary_expression)) {
                return false;
            }

            if (cur_token != tokenizer::TK_RIGHT_PAREN) {
                syntax_error({"')' expected"});
            } else {
                next();
            }
        } else if (t == tokenizer::TK_LEFT_BRACK) {
            if (cur_token != tokenizer::TK_RIGHT_BRACK) {
                if (!parse_expression(binary_expression)) {
                    return false;
                }
            }

            if (cur_token != tokenizer::TK_RIGHT_BRACK) {
                syntax_error({"']' expected"});
            } else {
                next();
            }
        } else {
            if (!parse_expression(binary_expression, p)) {
                return false;
            }
        }

        p = operator_precedence(cur_token.type);
    }
}